

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::OutputFile::Data::~Data(Data *this)

{
  value_type pLVar1;
  LineBuffer *pLVar2;
  reference ppLVar3;
  long in_RDI;
  size_t i;
  LineBuffer *this_00;
  LineBuffer *this_01;
  
  this_00 = (LineBuffer *)0x0;
  while( true ) {
    this_01 = this_00;
    pLVar2 = (LineBuffer *)
             std::
             vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
             ::size((vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                     *)(in_RDI + 0x108));
    if (pLVar2 <= this_00) break;
    ppLVar3 = std::
              vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
              ::operator[]((vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                            *)(in_RDI + 0x108),(size_type)this_01);
    pLVar1 = *ppLVar3;
    if (pLVar1 != (value_type)0x0) {
      anon_unknown_6::LineBuffer::~LineBuffer(this_00);
      operator_delete(pLVar1,0x90);
    }
    this_00 = (LineBuffer *)((long)&(this_01->buffer)._size + 1);
  }
  std::
  vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
  ::~vector((vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
             *)this_01);
  std::
  vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
  ::~vector((vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
             *)this_01);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01);
  FrameBuffer::~FrameBuffer((FrameBuffer *)0x215413);
  Header::~Header((Header *)this_01);
  return;
}

Assistant:

OutputFile::Data::~Data ()
{
    for (size_t i = 0; i < lineBuffers.size (); i++)
        delete lineBuffers[i];
}